

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
get_param::operator()
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          get_param *this,int arg_position,string_view longp,string_view shortp)

{
  bool bVar1;
  int iVar2;
  size_type __rlen;
  size_t __n;
  size_type sVar3;
  int iVar4;
  ulong __n_00;
  size_type __rlen_1;
  size_t sVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __n_00 = longp._M_len;
  pcVar6 = this->argv[arg_position];
  __n = strlen(pcVar6);
  this->i = arg_position;
  local_40._M_len = __n;
  local_40._M_str = pcVar6;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (&local_40,longp._M_str,0,__n_00);
  if (((__n_00 < __n) && (sVar3 == 0)) && ((pcVar6[__n_00] == '=' || (pcVar6[__n_00] == ':')))) {
    pcVar6 = pcVar6 + __n_00 + 1;
    sVar5 = __n - (__n_00 + 1);
  }
  else {
    local_40._M_len = __n;
    local_40._M_str = pcVar6;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_40,shortp._M_str,0,shortp._M_len);
    sVar5 = __n - shortp._M_len;
    if ((__n < shortp._M_len || sVar5 == 0) || (sVar3 != 0)) {
      iVar4 = arg_position + 1;
      if (this->argc <= iVar4) {
LAB_0011ddb0:
        bVar1 = false;
        goto LAB_0011dddd;
      }
      if (__n == __n_00) {
        if (__n_00 != 0) {
          iVar2 = bcmp(pcVar6,longp._M_str,__n_00);
          if (iVar2 != 0) goto LAB_0011dd90;
        }
      }
      else {
LAB_0011dd90:
        if (__n != shortp._M_len) goto LAB_0011ddb0;
        if (__n != 0) {
          iVar2 = bcmp(pcVar6,shortp._M_str,__n);
          if (iVar2 != 0) goto LAB_0011ddb0;
        }
      }
      this->i = iVar4;
      pcVar6 = this->argv[iVar4];
      sVar5 = strlen(pcVar6);
    }
    else {
      pcVar6 = pcVar6 + shortp._M_len;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = sVar5;
  bVar1 = true;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = pcVar6;
LAB_0011dddd:
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

constexpr std::optional<std::string_view> operator()(
      int arg_position,
      const std::string_view longp,
      const std::string_view shortp) noexcept
    {
        std::string_view arg(argv[arg_position]);
        i = arg_position;

        if (starts_with(arg, longp) && arg.size() > longp.size() &&
            (arg[longp.size()] == '=' || arg[longp.size()] == ':'))
            return arg.substr(longp.size() + 1);

        if (starts_with(arg, shortp) && arg.size() > shortp.size())
            return arg.substr(shortp.size());

        if (arg_position + 1 < argc) {
            if (arg == longp) {
                i = arg_position + 1;
                return argv[i];
            }

            if (arg == shortp) {
                i = arg_position + 1;
                return argv[i];
            }
        }

        return std::nullopt;
    }